

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

void opj_v4dwt_interleave_h
               (opj_v4dwt_t *dwt,OPJ_FLOAT32 *a,OPJ_UINT32 width,OPJ_UINT32 remaining_height)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  opj_v4_t *poVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  opj_v4_t *poVar8;
  OPJ_UINT32 *pOVar9;
  ulong uVar10;
  uint uVar11;
  OPJ_UINT32 *pOVar12;
  
  poVar4 = dwt->wavelet;
  iVar1 = dwt->cas;
  iVar2 = dwt->sn;
  pOVar9 = &dwt->win_l_x0;
  pOVar12 = &dwt->win_l_x1;
  lVar6 = (long)iVar1;
  for (iVar7 = 0; poVar8 = poVar4 + lVar6, iVar7 != 2; iVar7 = iVar7 + 1) {
    uVar3 = *pOVar12;
    uVar11 = *pOVar9;
    uVar10 = (ulong)uVar11;
    if (((((width & 0xf) == 0) && (3 < remaining_height)) && (((ulong)a & 0xf) == 0)) &&
       (((ulong)poVar8 & 0xf) == 0)) {
      uVar11 = uVar11 * 8;
      for (; uVar10 < uVar3; uVar10 = uVar10 + 1) {
        poVar8->f[uVar11] = a[uVar10];
        iVar5 = (int)uVar10;
        poVar8->f[uVar11 + 1] = a[width + iVar5];
        poVar8->f[uVar11 + 2] = a[width * 2 + iVar5];
        poVar8->f[uVar11 + 3] = a[width * 3 + iVar5];
        uVar11 = uVar11 + 8;
      }
    }
    else {
      uVar11 = uVar11 * 8;
      for (; uVar10 < uVar3; uVar10 = uVar10 + 1) {
        poVar8->f[uVar11] = a[uVar10];
        if (((remaining_height != 1) &&
            (iVar5 = (int)uVar10, poVar8->f[uVar11 + 1] = a[width + iVar5], remaining_height != 2))
           && (poVar8->f[uVar11 + 2] = a[width * 2 + iVar5], remaining_height != 3)) {
          poVar8->f[uVar11 + 3] = a[width * 3 + iVar5];
        }
        uVar11 = uVar11 + 8;
      }
    }
    a = a + iVar2;
    pOVar9 = &dwt->win_h_x0;
    pOVar12 = &dwt->win_h_x1;
    lVar6 = 1 - (long)iVar1;
  }
  return;
}

Assistant:

static void opj_v4dwt_interleave_h(opj_v4dwt_t* OPJ_RESTRICT dwt,
                                   OPJ_FLOAT32* OPJ_RESTRICT a,
                                   OPJ_UINT32 width,
                                   OPJ_UINT32 remaining_height)
{
    OPJ_FLOAT32* OPJ_RESTRICT bi = (OPJ_FLOAT32*)(dwt->wavelet + dwt->cas);
    OPJ_UINT32 i, k;
    OPJ_UINT32 x0 = dwt->win_l_x0;
    OPJ_UINT32 x1 = dwt->win_l_x1;

    for (k = 0; k < 2; ++k) {
        if (remaining_height >= 4 && ((OPJ_SIZE_T) a & 0x0f) == 0 &&
                ((OPJ_SIZE_T) bi & 0x0f) == 0 && (width & 0x0f) == 0) {
            /* Fast code path */
            for (i = x0; i < x1; ++i) {
                OPJ_UINT32 j = i;
                bi[i * 8    ] = a[j];
                j += width;
                bi[i * 8 + 1] = a[j];
                j += width;
                bi[i * 8 + 2] = a[j];
                j += width;
                bi[i * 8 + 3] = a[j];
            }
        } else {
            /* Slow code path */
            for (i = x0; i < x1; ++i) {
                OPJ_UINT32 j = i;
                bi[i * 8    ] = a[j];
                j += width;
                if (remaining_height == 1) {
                    continue;
                }
                bi[i * 8 + 1] = a[j];
                j += width;
                if (remaining_height == 2) {
                    continue;
                }
                bi[i * 8 + 2] = a[j];
                j += width;
                if (remaining_height == 3) {
                    continue;
                }
                bi[i * 8 + 3] = a[j]; /* This one*/
            }
        }

        bi = (OPJ_FLOAT32*)(dwt->wavelet + 1 - dwt->cas);
        a += dwt->sn;
        x0 = dwt->win_h_x0;
        x1 = dwt->win_h_x1;
    }
}